

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O3

void __thiscall
TasGrid::GridSequence::evalHierarchicalFunctions(GridSequence *this,double *x,double *fvalues)

{
  uint uVar1;
  long lVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  pointer pvVar8;
  long lVar9;
  double dVar10;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  cache;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_40;
  
  lVar7 = 0x18;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar7 = 0x40;
  }
  lVar9 = (long)*(int *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar7);
  cacheBasisValues<double>(&local_40,this,x);
  if (0 < lVar9) {
    lVar2 = *(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar7);
    lVar7 = *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar7);
    pdVar3 = ((local_40.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
    lVar4 = 0;
    lVar5 = lVar7;
    do {
      dVar10 = pdVar3[*(int *)(lVar7 + lVar2 * lVar4 * 4)];
      fvalues[lVar4] = dVar10;
      if (1 < (int)uVar1) {
        uVar6 = 1;
        pvVar8 = local_40.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pvVar8 = pvVar8 + 1;
          dVar10 = dVar10 * (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[*(int *)(lVar5 + uVar6 * 4)];
          fvalues[lVar4] = dVar10;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + lVar2 * 4;
    } while (lVar4 != lVar9);
  }
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_40);
  return;
}

Assistant:

void GridSequence::evalHierarchicalFunctions(const double x[], double fvalues[]) const{
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();

    std::vector<std::vector<double>> cache = cacheBasisValues<double>(x);

    for(int i=0; i<num_points; i++){
        const int* p = work.getIndex(i);
        fvalues[i] = cache[0][p[0]];
        for(int j=1; j<num_dimensions; j++){
            fvalues[i] *= cache[j][p[j]];
        }
    }
}